

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

void __thiscall
google::protobuf::FieldDescriptorProto::FieldDescriptorProto
          (FieldDescriptorProto *this,FieldDescriptorProto *from)

{
  (this->super_Message).super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__FieldDescriptorProto_00294cc0;
  UnknownFieldSet::UnknownFieldSet(&this->_unknown_fields_);
  this->_cached_size_ = 0;
  this->_has_bits_[0] = 0;
  this->name_ = (string *)internal::kEmptyString_abi_cxx11_;
  this->number_ = 0;
  this->label_ = 1;
  this->type_ = 1;
  this->type_name_ = (string *)internal::kEmptyString_abi_cxx11_;
  this->extendee_ = (string *)internal::kEmptyString_abi_cxx11_;
  this->default_value_ = (string *)internal::kEmptyString_abi_cxx11_;
  this->options_ = (FieldOptions *)0x0;
  MergeFrom(this,from);
  return;
}

Assistant:

FieldDescriptorProto::FieldDescriptorProto(const FieldDescriptorProto& from)
  : ::google::protobuf::Message() {
  SharedCtor();
  MergeFrom(from);
}